

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_write(FIOBJ dest,char *data,size_t len)

{
  ulong uVar1;
  fio_str_info_s local_20;
  
  if (((uint)dest & 7) == 2) {
    uVar1 = dest & 0xfffffffffffffff8;
    if (*(char *)(uVar1 + 0x11) == '\0') {
      *(undefined8 *)(uVar1 + 8) = 0;
      fio_str_write(&local_20,(fio_str_s_conflict *)(uVar1 + 0x10),data,len);
    }
    else {
      local_20.len = 0;
    }
    return local_20.len;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0xf6,"size_t fiobj_str_write(FIOBJ, const char *, size_t)");
}

Assistant:

size_t fiobj_str_write(FIOBJ dest, const char *data, size_t len) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write(&obj2str(dest)->str, data, len).len;
}